

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

bool __thiscall
TPZFMatrix<long_double>::Compare(TPZFMatrix<long_double> *this,TPZSavable *copy,bool override)

{
  longdouble lVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar5;
  double extraout_XMM0_Qa;
  double __x;
  stringstream sout;
  size_t in_stack_000001a8;
  char *in_stack_000001b0;
  longdouble exp;
  int64_t iel;
  int64_t numdif;
  longdouble diff;
  int64_t nel;
  bool matresult;
  TPZFMatrix<long_double> *fmat;
  long local_238;
  string local_220 [48];
  stringstream local_1f0 [16];
  ostream local_1e0 [351];
  undefined1 in_stack_ffffffffffffff7f;
  TPZSavable *in_stack_ffffffffffffff80;
  TPZMatrix<long_double> *in_stack_ffffffffffffff88;
  long local_58;
  long local_50;
  longdouble local_48;
  bool local_29;
  bool local_1;
  
  if (in_RSI == 0) {
    local_238 = 0;
  }
  else {
    local_238 = __dynamic_cast(in_RSI,&TPZSavable::typeinfo,&typeinfo,0);
  }
  if (local_238 == 0) {
    local_1 = false;
  }
  else {
    local_29 = TPZMatrix<long_double>::Compare
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          (bool)in_stack_ffffffffffffff7f);
    lVar2 = *(long *)(in_RDI + 8);
    lVar3 = *(long *)(in_RDI + 0x10);
    local_48 = (longdouble)0;
    local_50 = 0;
    __x = extraout_XMM0_Qa;
    for (local_58 = 0; local_58 < lVar2 * lVar3; local_58 = local_58 + 1) {
      lVar5 = *(longdouble *)(*(long *)(in_RDI + 0x20) + local_58 * 0x10);
      lVar1 = *(longdouble *)(*(long *)(local_238 + 0x20) + local_58 * 0x10);
      if ((lVar5 != lVar1) || (NAN(lVar5) || NAN(lVar1))) {
        local_29 = false;
        local_50 = local_50 + 1;
      }
      lVar5 = in_ST5;
      __x = std::fabs(__x);
      local_48 = local_48 + in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar5;
    }
    if (local_29 == false) {
      std::__cxx11::stringstream::stringstream(local_1f0);
      poVar4 = std::operator<<(local_1e0,
                               "virtual bool TPZFMatrix<long double>::Compare(TPZSavable *, bool) const [TVar = long double]"
                              );
      std::operator<<(poVar4," did not compare ");
      poVar4 = std::operator<<(local_1e0," number different terms ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
      poVar4 = std::operator<<(poVar4," number terms ");
      std::ostream::operator<<(poVar4,*(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10));
      poVar4 = std::operator<<(local_1e0," difference in norm L1 ");
      std::ostream::operator<<(poVar4,local_48);
      std::__cxx11::stringstream::str();
      poVar4 = std::operator<<((ostream *)&std::cout,local_220);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::stringstream::~stringstream(local_1f0);
      if ((in_DL & 1) != 0) {
        pzinternal::DebugStopImpl(in_stack_000001b0,in_stack_000001a8);
      }
    }
    local_1 = local_29;
  }
  return local_1;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        DebugStop();
    }
    return matresult;
}